

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O3

void virtio_legacy_setup_tx_queue(virtio_device *dev,uint16_t idx)

{
  undefined8 *puVar1;
  size_t size;
  uint uVar2;
  undefined2 *puVar3;
  long lVar4;
  FILE *__stream;
  int iVar5;
  ssize_t sVar6;
  void *__s;
  uint *puVar7;
  mempool *pmVar8;
  long lVar9;
  virtio_device *unaff_RBX;
  long lVar10;
  int __fd;
  uint num_entries;
  dma_memory dVar11;
  ushort auStack_280 [256];
  virtio_device *pvStack_80;
  void *local_78;
  ulong local_70;
  ushort local_5c;
  ushort local_5a;
  undefined2 *local_58;
  uint16_t local_4a;
  ulong local_48;
  void *local_40;
  undefined4 local_34;
  
  if ((ushort)(idx - 3) < 0xfffe) {
    pvStack_80 = (virtio_device *)0x1070ae;
    virtio_legacy_setup_tx_queue_cold_5();
    __fd = (int)dev;
LAB_001070ae:
    pvStack_80 = (virtio_device *)0x1070b3;
    virtio_legacy_setup_tx_queue_cold_1();
LAB_001070b3:
    pvStack_80 = (virtio_device *)0x1070b8;
    virtio_legacy_setup_tx_queue_cold_2();
  }
  else {
    __fd = dev->fd;
    pvStack_80 = (virtio_device *)0x106e10;
    local_4a = idx;
    sVar6 = pwrite(__fd,&local_4a,2,0xe);
    unaff_RBX = dev;
    if (sVar6 != 2) goto LAB_001070ae;
    __fd = dev->fd;
    pvStack_80 = (virtio_device *)0x106e31;
    sVar6 = pread(__fd,&local_5c,2,0xc);
    if (sVar6 != 2) goto LAB_001070b3;
    local_78 = (void *)CONCAT44(local_78._4_4_,(uint)local_5c);
    pvStack_80 = (virtio_device *)0x106e75;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): Max queue size of tx queue #%u: %u\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x37,"virtio_legacy_setup_tx_queue",idx);
    num_entries = (uint)local_5c;
    if (local_5c == 0) {
      return;
    }
    local_48 = (ulong)((uint)local_5c * 8);
    size = (ulong)(((uint)local_5c + (uint)local_5c * 8) * 2 + 0x1003 & 0x3ff000) + 4 + local_48;
    pvStack_80 = (virtio_device *)0x106eb8;
    dVar11 = memory_allocate_dma(size,true);
    local_58 = (undefined2 *)dVar11.phy;
    __s = dVar11.virt;
    pvStack_80 = (virtio_device *)0x106ed0;
    memset(__s,0xab,size);
    pvStack_80 = (virtio_device *)0x106f01;
    local_78 = __s;
    local_40 = __s;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): Allocated %zu bytes for virt queue at %p\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x3e,"virtio_legacy_setup_tx_queue",size);
    __fd = dev->fd;
    local_34 = (undefined4)((ulong)local_58 >> 0xc);
    pvStack_80 = (virtio_device *)0x106f23;
    sVar6 = pwrite(__fd,&local_34,4,8);
    if (sVar6 == 4) {
      pvStack_80 = (virtio_device *)0x106f43;
      puVar7 = (uint *)calloc(1,local_48 + 0x38);
      *puVar7 = num_entries;
      __stream = _stderr;
      *(void **)(puVar7 + 2) = local_40;
      local_78 = (void *)((ulong)local_5c * 0x10 + (long)local_40);
      *(void **)(puVar7 + 4) = local_78;
      local_70 = (long)local_78 + (ulong)num_entries * 2 + 0x1003 & 0xfffffffffffff000;
      *(ulong *)(puVar7 + 6) = local_70;
      pvStack_80 = (virtio_device *)0x106fa1;
      fprintf(__stream,"[DEBUG] %s:%d %s(): vring desc: %p, vring avail: %p, vring used: %p\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
              ,0x44,"virtio_legacy_setup_tx_queue");
      uVar2 = *puVar7;
      puVar3 = *(undefined2 **)(puVar7 + 6);
      if ((ulong)uVar2 != 0) {
        lVar9 = *(long *)(puVar7 + 2);
        lVar4 = *(long *)(puVar7 + 4);
        lVar10 = 0;
        do {
          puVar1 = (undefined8 *)(lVar9 + lVar10 * 8);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined2 *)(lVar4 + 4 + lVar10) = 0;
          *(undefined8 *)(puVar3 + lVar10 * 2 + 2) = 0;
          lVar10 = lVar10 + 2;
        } while ((ulong)uVar2 * 2 != lVar10);
      }
      puVar3[1] = 0;
      local_58 = *(undefined2 **)(puVar7 + 4);
      local_58[1] = 0;
      *(undefined2 *)(puVar7 + 10) = 0;
      __fd = dev->fd;
      pvStack_80 = (virtio_device *)0x107011;
      sVar6 = pread(__fd,&local_5a,2,0x10);
      if (sVar6 == 2) {
        pvStack_80 = (virtio_device *)0x10704b;
        fprintf(_stderr,"[DEBUG] %s:%d %s(): vq notifcation offset %u\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                ,0x54,"virtio_legacy_setup_tx_queue",(ulong)local_5a);
        *(ulong *)(puVar7 + 8) = (ulong)local_5a;
        if (idx == 2) {
          pvStack_80 = (virtio_device *)0x107064;
          pmVar8 = memory_allocate_mempool(num_entries,0x800);
          *(mempool **)(puVar7 + 0xc) = pmVar8;
          **(undefined2 **)(puVar7 + 4) = 1;
          **(undefined2 **)(puVar7 + 6) = 0;
        }
        else {
          *local_58 = 1;
          lVar9 = 0x80;
          *puVar3 = 0;
          if (idx == 1) goto LAB_001070a0;
        }
        lVar9 = 0x88;
LAB_001070a0:
        *(uint **)((long)&(dev->ixy).pci_addr + lVar9) = puVar7;
        return;
      }
      goto LAB_001070bd;
    }
  }
  pvStack_80 = (virtio_device *)0x1070bd;
  virtio_legacy_setup_tx_queue_cold_3();
LAB_001070bd:
  pvStack_80 = (virtio_device *)0x1070c2;
  virtio_legacy_setup_tx_queue_cold_4();
  pvStack_80 = unaff_RBX;
  iVar5 = ioctl(__fd,0x3b6c);
  if (iVar5 == -1) {
    vfio_enable_dma_cold_1();
  }
  else {
    auStack_280[0] = 0;
    sVar6 = pread(__fd,auStack_280,2,4);
    if (sVar6 == 2) {
      auStack_280[0] = auStack_280[0] | 4;
      sVar6 = pwrite(__fd,auStack_280,2,4);
      if (sVar6 != 2) {
        __assert_fail("pwrite(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                      ,0x27,"void vfio_enable_dma(int)");
      }
      return;
    }
  }
  __assert_fail("pread(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                ,0x25,"void vfio_enable_dma(int)");
}

Assistant:

static void virtio_legacy_setup_tx_queue(struct virtio_device* dev, uint16_t idx) {
	if (idx != 1 && idx != 2) {
		error("Can't setup queue %u as Tx queue", idx);
	}

	// Create virt queue itself - Section 4.1.5.1.3
	write_io16(dev->fd, idx, VIRTIO_PCI_QUEUE_SEL);
	uint32_t max_queue_size = read_io16(dev->fd, VIRTIO_PCI_QUEUE_NUM);
	debug("Max queue size of tx queue #%u: %u", idx, max_queue_size);
	if (max_queue_size == 0) {
		return;
	}
	size_t virt_queue_mem_size = virtio_legacy_vring_size(max_queue_size, 4096);
	struct dma_memory mem = memory_allocate_dma(virt_queue_mem_size, true);
	memset(mem.virt, 0xab, virt_queue_mem_size);
	debug("Allocated %zu bytes for virt queue at %p", virt_queue_mem_size, mem.virt);
	write_io32(dev->fd, mem.phy >> VIRTIO_PCI_QUEUE_ADDR_SHIFT, VIRTIO_PCI_QUEUE_PFN);

	// Section 2.4.2 for layout
	struct virtqueue* vq = calloc(1, sizeof(*vq) + sizeof(void*) * max_queue_size);
	virtio_legacy_vring_init(&vq->vring, max_queue_size, mem.virt, 4096);
	debug("vring desc: %p, vring avail: %p, vring used: %p", vq->vring.desc, vq->vring.avail, vq->vring.used);
	for (size_t i = 0; i < vq->vring.num; ++i) {
		vq->vring.desc[i].len = 0;
		vq->vring.desc[i].addr = 0;
		vq->vring.desc[i].flags = 0;
		vq->vring.desc[i].next = 0;
		vq->vring.avail->ring[i] = 0;
		vq->vring.used->ring[i].id = 0;
		vq->vring.used->ring[i].len = 0;
	}
	vq->vring.used->idx = 0;
	vq->vring.avail->idx = 0;
	vq->vq_used_last_idx = 0;

	// Section 4.1.4.4
	uint32_t notify_offset = read_io16(dev->fd, VIRTIO_PCI_QUEUE_NOTIFY);
	debug("vq notifcation offset %u", notify_offset);
	vq->notification_offset = notify_offset;

	// Ctrl queue packets are not supplied by the user
	if (idx == 2) {
		vq->mempool = memory_allocate_mempool(max_queue_size, 2048);
	}

	// Disable interrupts - Section 2.4.7
	vq->vring.avail->flags = VRING_AVAIL_F_NO_INTERRUPT;
	vq->vring.used->flags = 0;

	if (idx == 1) {
		dev->tx_queue = vq;
	} else {
		dev->ctrl_queue = vq;
	}
}